

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int32_t submit_headers_shared_nva
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,
                  nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,size_t nvlen,
                  nghttp2_data_provider *data_prd,void *stream_user_data)

{
  nghttp2_mem *mem;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_nv *nva_copy;
  int rv;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  nghttp2_priority_spec *pri_spec_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  if (pri_spec == (nghttp2_priority_spec *)0x0) {
    nghttp2_priority_spec_default_init((nghttp2_priority_spec *)((long)&mem + 4));
  }
  else {
    mem._4_4_ = pri_spec->stream_id;
    unique0x00012004 = pri_spec->weight;
    copy_pri_spec.stream_id = *(int32_t *)&pri_spec->exclusive;
    nghttp2_priority_spec_normalize_weight((nghttp2_priority_spec *)((long)&mem + 4));
  }
  session_local._4_4_ =
       nghttp2_nv_array_copy((nghttp2_nv **)&copy_pri_spec.weight,nva,nvlen,&session->mem);
  if (-1 < session_local._4_4_) {
    session_local._4_4_ =
         submit_headers_shared
                   (session,flags,stream_id,(nghttp2_priority_spec *)((long)&mem + 4),
                    (nghttp2_nv *)copy_pri_spec._4_8_,nvlen,data_prd,stream_user_data);
  }
  return session_local._4_4_;
}

Assistant:

static int32_t submit_headers_shared_nva(nghttp2_session *session,
                                         uint8_t flags, int32_t stream_id,
                                         const nghttp2_priority_spec *pri_spec,
                                         const nghttp2_nv *nva, size_t nvlen,
                                         const nghttp2_data_provider *data_prd,
                                         void *stream_user_data) {
  int rv;
  nghttp2_nv *nva_copy;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_mem *mem;

  mem = &session->mem;

  if (pri_spec) {
    copy_pri_spec = *pri_spec;
    nghttp2_priority_spec_normalize_weight(&copy_pri_spec);
  } else {
    nghttp2_priority_spec_default_init(&copy_pri_spec);
  }

  rv = nghttp2_nv_array_copy(&nva_copy, nva, nvlen, mem);
  if (rv < 0) {
    return rv;
  }

  return submit_headers_shared(session, flags, stream_id, &copy_pri_spec,
                               nva_copy, nvlen, data_prd, stream_user_data);
}